

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_host_destroy(ENetHost *host)

{
  ENetPeer *local_18;
  ENetPeer *currentPeer;
  ENetHost *host_local;
  
  if (host != (ENetHost *)0x0) {
    enet_socket_destroy(host->socket);
    for (local_18 = host->peers; local_18 < host->peers + host->peerCount; local_18 = local_18 + 1)
    {
      enet_peer_reset(local_18);
    }
    enet_free(host->peers);
    enet_free(host);
  }
  return;
}

Assistant:

void enet_host_destroy(ENetHost* host) {
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("A ENet host object is being destroyed.");

	if (host == NULL)
		return;

	enet_socket_destroy(host->socket);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		enet_peer_reset(currentPeer);
	}

	enet_free(host->peers);
	enet_free(host);
}